

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_motif(args_t *this,char *str)

{
  size_t sVar1;
  void *pvVar2;
  char *in_RSI;
  long in_RDI;
  int L;
  
  sVar1 = strlen(in_RSI);
  if ((int)sVar1 < 4) {
    ERROR("motif list must be at least 4 characters long: %s",in_RSI);
  }
  else {
    pvVar2 = malloc((long)((int)sVar1 + 1));
    *(void **)(in_RDI + 0x10) = pvVar2;
    strcpy(*(char **)(in_RDI + 0x10),in_RSI);
  }
  return;
}

Assistant:

void args_t::parse_motif ( const char * str  ) {
        const int L = strlen (str);
        if (L >= 4) {
            motif_list = (char*)malloc (L + 1);
            strcpy (motif_list, str);
        } else {
            ERROR( "motif list must be at least 4 characters long: %s", str );
        }
    }